

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceGLImpl::OnReleaseTexture(RenderDeviceGLImpl *this,ITexture *pTexture)

{
  SpinLock *this_00;
  byte bVar1;
  __node_base *p_Var2;
  
  this_00 = &this->m_FBOCacheLock;
  LOCK();
  bVar1 = (this->m_FBOCacheLock).m_IsLocked._M_base._M_i;
  (this->m_FBOCacheLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  while ((bVar1 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar1 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  p_Var2 = &(this->m_FBOCache)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    FBOCache::OnReleaseTexture((FBOCache *)(p_Var2 + 2),pTexture);
  }
  Threading::SpinLock::unlock(this_00);
  return;
}

Assistant:

void RenderDeviceGLImpl::OnReleaseTexture(ITexture* pTexture)
{
    Threading::SpinLockGuard FBOCacheGuard{m_FBOCacheLock};
    for (auto& FBOCacheIt : m_FBOCache)
        FBOCacheIt.second.OnReleaseTexture(pTexture);
}